

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

void curses_pause(nh_pause_reason reason)

{
  nh_pause_reason reason_local;
  
  doupdate();
  if ((reason == P_MESSAGE) && (msgwin != (WINDOW_conflict *)0x0)) {
    pause_messages();
  }
  else if (mapwin != (WINDOW_conflict *)0x0) {
    get_map_key(L'\0');
  }
  return;
}

Assistant:

void curses_pause(enum nh_pause_reason reason)
{
    doupdate();
    if (reason == P_MESSAGE && msgwin != NULL)
	pause_messages();
    else if (mapwin != NULL)
	/* P_MAP: pause to show the result of detection or similar */
	get_map_key(FALSE);
}